

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O0

uint32_t ClampedAddSubtractFull(uint32_t c0,uint32_t c1,uint32_t c2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int b;
  int g;
  int r;
  int a;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  iVar1 = AddSubtractComponentFull
                    (in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  iVar2 = AddSubtractComponentFull
                    (in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  iVar3 = AddSubtractComponentFull
                    (in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  uVar4 = AddSubtractComponentFull
                    (in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  return iVar1 << 0x18 | iVar2 << 0x10 | iVar3 << 8 | uVar4;
}

Assistant:

static WEBP_INLINE uint32_t ClampedAddSubtractFull(uint32_t c0, uint32_t c1,
                                                   uint32_t c2) {
  const int a = AddSubtractComponentFull(c0 >> 24, c1 >> 24, c2 >> 24);
  const int r = AddSubtractComponentFull((c0 >> 16) & 0xff,
                                         (c1 >> 16) & 0xff,
                                         (c2 >> 16) & 0xff);
  const int g = AddSubtractComponentFull((c0 >> 8) & 0xff,
                                         (c1 >> 8) & 0xff,
                                         (c2 >> 8) & 0xff);
  const int b = AddSubtractComponentFull(c0 & 0xff, c1 & 0xff, c2 & 0xff);
  return ((uint32_t)a << 24) | (r << 16) | (g << 8) | b;
}